

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::ReadFile(Error *__return_storage_ptr__,string *aData,string *aFilename)

{
  string *psVar1;
  int iVar2;
  char *__filename;
  int *piVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  char *pcStack_2a0;
  int c;
  anon_class_1_0_00000001 local_292;
  v10 local_291;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_290;
  string local_280;
  Error local_260;
  char *local_238;
  anon_class_1_0_00000001 local_22a;
  v10 local_229;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_228;
  string local_218;
  Error local_1f8;
  FILE *local_1c0;
  FILE *f;
  string *local_1b0;
  string *aFilename_local;
  string *aData_local;
  Error *error;
  undefined1 local_170 [16];
  v10 *local_160;
  char *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  string *local_148;
  v10 *local_140;
  char *pcStack_138;
  string *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_128;
  undefined1 local_108 [16];
  v10 *local_f8;
  char *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  string *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_b8;
  v10 *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  v10 **local_80;
  v10 *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  f._7_1_ = 0;
  local_1b0 = aFilename;
  aFilename_local = aData;
  aData_local = (string *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  __filename = (char *)std::__cxx11::string::c_str();
  local_1c0 = fopen(__filename,"r");
  if (local_1c0 == (FILE *)0x0) {
    piVar3 = __errno_location();
    if (*piVar3 == 2) {
      ReadFile::anon_class_1_0_00000001::operator()(&local_22a);
      local_b8 = &local_228;
      local_c0 = &local_229;
      bVar4 = ::fmt::v10::operator()(local_c0);
      local_228._8_8_ = bVar4.size_;
      local_228._M_allocated_capacity = (size_type)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                ();
      psVar1 = local_1b0;
      piVar3 = __errno_location();
      local_238 = strerror(*piVar3);
      local_c8 = &local_218;
      local_d8 = (v10 *)local_228._M_allocated_capacity;
      pcStack_d0 = (char *)local_228._8_8_;
      local_e0 = psVar1;
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238;
      local_a0 = &local_d8;
      local_f8 = (v10 *)local_228._M_allocated_capacity;
      local_f0 = (char *)local_228._8_8_;
      local_98 = local_f8;
      pcStack_90 = local_f0;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
                (&local_128,(v10 *)psVar1,local_e8,(char **)local_228._M_allocated_capacity);
      local_60 = local_108;
      local_68 = &local_128;
      local_18 = 0xcd;
      fmt.size_ = 0xcd;
      fmt.data_ = local_f0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_68;
      local_40 = local_68;
      local_20 = local_68;
      local_10 = local_60;
      ::fmt::v10::vformat_abi_cxx11_(&local_218,local_f8,fmt,args);
      Error::Error(&local_1f8,kNotFound,&local_218);
      Error::operator=(__return_storage_ptr__,&local_1f8);
      Error::~Error(&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      ReadFile::anon_class_1_0_00000001::operator()(&local_292);
      local_a8 = &local_290;
      local_b0 = &local_291;
      bVar4 = ::fmt::v10::operator()(local_b0);
      local_290._8_8_ = bVar4.size_;
      local_290._M_allocated_capacity = (size_type)bVar4.data_;
      ::fmt::v10::detail::
      check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                ();
      psVar1 = local_1b0;
      piVar3 = __errno_location();
      pcStack_2a0 = strerror(*piVar3);
      local_130 = &local_280;
      local_140 = (v10 *)local_290._M_allocated_capacity;
      pcStack_138 = (char *)local_290._8_8_;
      local_148 = psVar1;
      local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xfffffffffffffd60;
      local_80 = &local_140;
      local_160 = (v10 *)local_290._M_allocated_capacity;
      local_158 = (char *)local_290._8_8_;
      local_78 = local_160;
      pcStack_70 = local_158;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
                ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                  *)&error,(v10 *)psVar1,local_150,(char **)local_290._M_allocated_capacity);
      local_50 = local_170;
      local_58 = &error;
      local_30 = 0xcd;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = local_158;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_58;
      local_48 = local_58;
      local_38 = local_58;
      local_28 = local_50;
      ::fmt::v10::vformat_abi_cxx11_(&local_280,local_160,fmt_00,args_00);
      Error::Error(&local_260,kIOError,&local_280);
      Error::operator=(__return_storage_ptr__,&local_260);
      Error::~Error(&local_260);
      std::__cxx11::string::~string((string *)&local_280);
    }
  }
  else {
    while (iVar2 = fgetc(local_1c0), iVar2 != -1) {
      std::__cxx11::string::push_back((char)aFilename_local);
    }
  }
  if (local_1c0 != (FILE *)0x0) {
    fclose(local_1c0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ReadFile(std::string &aData, const std::string &aFilename)
{
    Error error;

    FILE *f = fopen(aFilename.c_str(), "r");

    if (f == nullptr)
    {
        if (errno == ENOENT)
        {
            ExitNow(error = ERROR_NOT_FOUND("cannot open file '{}', {}", aFilename, strerror(errno)));
        }
        else
        {
            ExitNow(error = ERROR_IO_ERROR("cannot open file '{}', {}", aFilename, strerror(errno)));
        }
    }

    while (true)
    {
        int c = fgetc(f);
        VerifyOrExit(c != EOF);
        aData.push_back(c);
    }

exit:
    if (f != nullptr)
    {
        fclose(f);
    }

    return error;
}